

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<FPortalBlock,_FPortalBlock>::ShrinkToFit(TArray<FPortalBlock,_FPortalBlock> *this)

{
  uint uVar1;
  FPortalBlock *pFVar2;
  
  uVar1 = this->Count;
  if (uVar1 < this->Most) {
    this->Most = uVar1;
    if (uVar1 == 0) {
      if (this->Array == (FPortalBlock *)0x0) {
        return;
      }
      M_Free(this->Array);
      pFVar2 = (FPortalBlock *)0x0;
    }
    else {
      pFVar2 = (FPortalBlock *)
               M_Realloc_Dbg(this->Array,(ulong)uVar1 * 0x18,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                             ,0x1a8);
    }
    this->Array = pFVar2;
  }
  return;
}

Assistant:

void ShrinkToFit ()
	{
		if (Most > Count)
		{
			Most = Count;
			if (Most == 0)
			{
				if (Array != NULL)
				{
					M_Free (Array);
					Array = NULL;
				}
			}
			else
			{
				DoResize ();
			}
		}
	}